

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O3

uint32_t __thiscall
google::protobuf::io::CodedInputStream::ReadTagFallback
          (CodedInputStream *this,uint32_t first_byte_or_zero)

{
  Nonnull<const_char_*> failure_msg;
  byte *pbVar1;
  int iVar2;
  uint32_t uVar4;
  LogMessage local_20;
  int iVar3;
  
  pbVar1 = this->buffer_;
  iVar3 = (int)this->buffer_end_;
  iVar2 = iVar3 - (int)pbVar1;
  if (9 < iVar2) {
LAB_0044f3ed:
    if (*pbVar1 == first_byte_or_zero) {
      if (first_byte_or_zero == 0) {
        this->buffer_ = pbVar1 + 1;
        return 0;
      }
      if ((char)first_byte_or_zero < '\0') {
        uVar4 = ((uint)pbVar1[1] * 0x80 + first_byte_or_zero) - 0x80;
        if ((char)pbVar1[1] < '\0') {
          uVar4 = (uVar4 + (uint)pbVar1[2] * 0x4000) - 0x4000;
          if ((char)pbVar1[2] < '\0') {
            uVar4 = (uVar4 + (uint)pbVar1[3] * 0x200000) - 0x200000;
            if ((char)pbVar1[3] < '\0') {
              uVar4 = uVar4 + (uint)pbVar1[4] * 0x10000000 + 0xf0000000;
              if ((char)pbVar1[4] < '\0') {
                pbVar1 = pbVar1 + 6;
                iVar2 = 5;
                while ((char)pbVar1[-1] < '\0') {
                  pbVar1 = pbVar1 + 1;
                  iVar2 = iVar2 + -1;
                  if (iVar2 == 0) {
                    return 0;
                  }
                }
              }
              else {
                pbVar1 = pbVar1 + 5;
              }
            }
            else {
              pbVar1 = pbVar1 + 4;
            }
          }
          else {
            pbVar1 = pbVar1 + 3;
          }
        }
        else {
          pbVar1 = pbVar1 + 2;
        }
        this->buffer_ = pbVar1;
        return uVar4;
      }
    }
    else {
      ReadTagFallback();
    }
    failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            (0,0x80,"first_byte & 0x80 == 0x80");
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.cc"
               ,0x1af,failure_msg);
    absl::lts_20250127::log_internal::LogMessage::operator<<(&local_20,first_byte_or_zero);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_20);
  }
  if (iVar2 < 1) {
    if (iVar3 == (int)pbVar1) {
      if (((0 < this->buffer_size_after_limit_) || (this->total_bytes_read_ == this->current_limit_)
          ) && (this->total_bytes_read_ - this->buffer_size_after_limit_ < this->total_bytes_limit_)
         ) {
        this->legitimate_message_end_ = true;
        return 0;
      }
    }
  }
  else if (-1 < (char)this->buffer_end_[-1]) goto LAB_0044f3ed;
  uVar4 = ReadTagSlow(this);
  return uVar4;
}

Assistant:

uint32_t CodedInputStream::ReadTagFallback(uint32_t first_byte_or_zero) {
  const int buf_size = BufferSize();
  if (buf_size >= kMaxVarintBytes ||
      // Optimization:  We're also safe if the buffer is non-empty and it ends
      // with a byte that would terminate a varint.
      (buf_size > 0 && !(buffer_end_[-1] & 0x80))) {
    ABSL_DCHECK_EQ(first_byte_or_zero, buffer_[0]);
    if (first_byte_or_zero == 0) {
      ++buffer_;
      return 0;
    }
    uint32_t tag;
    ::std::pair<bool, const uint8_t*> p =
        ReadVarint32FromArray(first_byte_or_zero, buffer_, &tag);
    if (!p.first) {
      return 0;
    }
    buffer_ = p.second;
    return tag;
  } else {
    // We are commonly at a limit when attempting to read tags. Try to quickly
    // detect this case without making another function call.
    if ((buf_size == 0) &&
        ((buffer_size_after_limit_ > 0) ||
         (total_bytes_read_ == current_limit_)) &&
        // Make sure that the limit we hit is not total_bytes_limit_, since
        // in that case we still need to call Refresh() so that it prints an
        // error.
        total_bytes_read_ - buffer_size_after_limit_ < total_bytes_limit_) {
      // We hit a byte limit.
      legitimate_message_end_ = true;
      return 0;
    }
    return ReadTagSlow();
  }
}